

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkStrash.c
# Opt level: O2

void Nwk_ManStrashNode_rec(Aig_Man_t *p,Hop_Obj_t *pObj)

{
  uint __line;
  ulong *puVar1;
  Aig_Obj_t *p1;
  Aig_Obj_t *pAVar2;
  char *__assertion;
  
  if (((ulong)pObj & 1) != 0) {
    __assertion = "!Hop_IsComplement(pObj)";
    __line = 0x2f;
LAB_00716d19:
    __assert_fail(__assertion,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/nwk/nwkStrash.c"
                  ,__line,"void Nwk_ManStrashNode_rec(Aig_Man_t *, Hop_Obj_t *)");
  }
  if ((*(uint *)&pObj->field_0x20 & 0x16) == 4) {
    Nwk_ManStrashNode_rec(p,(Hop_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe));
    Nwk_ManStrashNode_rec(p,(Hop_Obj_t *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe));
    puVar1 = (ulong *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe);
    if (puVar1 == (ulong *)0x0) {
      pAVar2 = (Aig_Obj_t *)0x0;
    }
    else {
      pAVar2 = (Aig_Obj_t *)((ulong)((uint)pObj->pFanin0 & 1) ^ *puVar1);
    }
    puVar1 = (ulong *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe);
    if (puVar1 == (ulong *)0x0) {
      p1 = (Aig_Obj_t *)0x0;
    }
    else {
      p1 = (Aig_Obj_t *)((ulong)((uint)pObj->pFanin1 & 1) ^ *puVar1);
    }
    pAVar2 = Aig_And(p,pAVar2,p1);
    (pObj->field_0).pData = pAVar2;
    if ((*(uint *)&pObj->field_0x20 & 0x10) != 0) {
      __assertion = "!Hop_ObjIsMarkA(pObj)";
      __line = 0x35;
      goto LAB_00716d19;
    }
    *(uint *)&pObj->field_0x20 = *(uint *)&pObj->field_0x20 | 0x10;
  }
  return;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Derives AIG from the local functions of the node.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Nwk_ManStrashNode_rec( Aig_Man_t * p, Hop_Obj_t * pObj )
{
    assert( !Hop_IsComplement(pObj) );
    if ( !Hop_ObjIsNode(pObj) || Hop_ObjIsMarkA(pObj) )
        return;
    Nwk_ManStrashNode_rec( p, Hop_ObjFanin0(pObj) ); 
    Nwk_ManStrashNode_rec( p, Hop_ObjFanin1(pObj) );
    pObj->pData = Aig_And( p, (Aig_Obj_t *)Hop_ObjChild0Copy(pObj), (Aig_Obj_t *)Hop_ObjChild1Copy(pObj) );
    assert( !Hop_ObjIsMarkA(pObj) ); // loop detection
    Hop_ObjSetMarkA( pObj );
}